

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.cpp
# Opt level: O1

bool __thiscall
embree::motion_derivative_regression_test::run(motion_derivative_regression_test *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>,_float>
  __aurng;
  float fVar11;
  float __x;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  uint numRoots;
  AffineSpace3fa M1;
  Vec3fa axis;
  float roots [32];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_4e8;
  undefined8 local_4d8;
  long lStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  long lStack_4b0;
  undefined1 local_4a8 [8];
  undefined8 uStack_4a0;
  undefined1 local_498 [8];
  undefined8 uStack_490;
  undefined1 local_488 [24];
  ulong local_470;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_468;
  undefined8 local_458;
  long lStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  long lStack_430;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_428;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined1 local_3e8 [16];
  float local_3d8;
  float local_3c8;
  undefined4 uStack_3c4;
  undefined4 uStack_3c0;
  float fStack_3bc;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3b8;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  float local_358 [32];
  MotionDerivativeCoefficients local_2d8;
  
  uVar9 = 0xb1413fa1;
  (this->rng)._M_x[0] = 0xb1413fa1;
  lVar6 = 1;
  lVar7 = 6;
  do {
    lVar8 = (uVar9 >> 0x3e ^ uVar9) * 0x5851f42d4c957f2d;
    uVar9 = lVar8 + lVar6;
    (this->rng)._M_x[lVar7 + -5] = (lVar7 + lVar8) - 5;
    lVar6 = lVar6 + 1;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x13d);
  (this->rng)._M_p = 0x138;
  local_2d8.theta = -2.0;
  local_2d8.coeffs[0] = 2.0;
  local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffff00000000;
  MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
            ((EvalFunc *)&local_468.field_1,(Interval1f *)&local_2d8,(uint *)local_4e8.m128,
             local_358,0x20);
  if (((local_4e8.m128[0] == 2.8026e-45) && (ABS(local_358[0] + 1.0) <= 1e+06)) &&
     (ABS(local_358[1] + -1.0) <= 1e+06)) {
    local_2d8.theta = -2.0;
    local_2d8.coeffs[0] = 2.0;
    local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffff00000000;
    MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
              ((EvalFunc *)&local_468.field_1,(Interval1f *)&local_2d8,(uint *)local_4e8.m128,
               local_358,0x20);
    if (local_4e8.m128[0] == 2.8026e-45) {
      local_2d8.theta = -2.0;
      local_2d8.coeffs[0] = 2.0;
      local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffff00000000;
      MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                ((EvalFunc *)&local_468.field_1,(Interval1f *)&local_2d8,(uint *)local_4e8.m128,
                 local_358,0x20);
      if (local_4e8.m128[0] == 4.2039e-45) {
        local_2d8.theta = 0.5;
        local_2d8.coeffs[0] = 1.4;
        local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffff00000000;
        MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                  ((EvalFunc *)&local_468.field_1,(Interval1f *)&local_2d8,(uint *)local_4e8.m128,
                   local_358,0x20);
        if (local_4e8.m128[0] == 4.2039e-45) {
          local_2d8.theta = 0.0;
          local_2d8.coeffs[0] = 7.0;
          local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffff00000000;
          MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                    ((EvalFunc *)&local_468.field_1,(Interval1f *)&local_2d8,(uint *)local_4e8.m128,
                     local_358,0x20);
          if (local_4e8.m128[0] == 9.80909e-45) {
            local_2d8.theta = 0.0;
            local_2d8.coeffs[0] = 7.0;
            local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffff00000000;
            MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                      ((EvalFunc *)&local_468.field_1,(Interval1f *)&local_2d8,
                       (uint *)local_4e8.m128,local_358,0x20);
            if (local_4e8.m128[0] == 9.80909e-45) {
              local_2d8.theta = 0.0;
              local_2d8.coeffs[0] = 2.0;
              local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffff00000000;
              MotionDerivative::
              findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                        ((EvalFunc *)&local_468.field_1,(Interval1f *)&local_2d8,
                         (uint *)local_4e8.m128,local_358,0x20);
              if (local_4e8.m128[0] == 9.80909e-45) {
                lVar6 = 0;
                do {
                  if (1e-06 < ABS(((float)(int)lVar6 * -3.1415927) / 10.0 + local_358[lVar6])) {
                    return false;
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 7);
                iVar10 = 0x40;
                while( true ) {
                  random_quaternion_decomposition((AffineSpace3fa *)&local_4e8.field_1,this);
                  random_quaternion_decomposition((AffineSpace3fa *)&local_468.field_1,this);
                  local_428._0_8_ = local_4e8._0_8_;
                  local_428._8_8_ = local_4e8._8_8_;
                  local_418 = local_4d8;
                  uStack_410 = lStack_4d0;
                  local_408 = local_4c8;
                  uStack_400 = uStack_4c0;
                  local_3f8 = local_4b8;
                  uStack_3f0 = lStack_4b0;
                  local_3b8._0_8_ = local_468._0_8_;
                  local_3b8._8_8_ = local_468._8_8_;
                  local_3a8 = local_458;
                  uStack_3a0 = lStack_450;
                  local_398 = local_448;
                  uStack_390 = uStack_440;
                  local_388 = local_438;
                  uStack_380 = lStack_430;
                  MotionDerivativeCoefficients::MotionDerivativeCoefficients
                            (&local_2d8,(AffineSpace3ff *)&local_428.field_1,
                             (AffineSpace3ff *)&local_3b8.field_1);
                  bVar3 = testMDC(this,&local_2d8);
                  if (!bVar3) break;
                  local_428._0_8_ = local_4e8._0_8_;
                  local_428._8_8_ = local_4e8._8_8_;
                  local_418 = local_4d8;
                  uStack_410 = lStack_4d0;
                  local_408 = local_4c8;
                  uStack_400 = uStack_4c0;
                  local_3f8 = local_4b8;
                  uStack_3f0 = lStack_4b0;
                  local_3b8._0_8_ = local_4e8._0_8_;
                  local_3b8._8_8_ = local_4e8._8_8_;
                  local_3a8 = local_4d8;
                  uStack_3a0 = lStack_4d0;
                  local_398 = local_4c8;
                  uStack_390 = uStack_4c0;
                  local_388 = local_4b8;
                  uStack_380 = lStack_4b0;
                  MotionDerivativeCoefficients::MotionDerivativeCoefficients
                            (&local_2d8,(AffineSpace3ff *)&local_428.field_1,
                             (AffineSpace3ff *)&local_3b8.field_1);
                  bVar3 = testMDC(this,&local_2d8);
                  if (!bVar3) {
                    return false;
                  }
                  iVar10 = iVar10 + -1;
                  if (iVar10 == 0) {
                    bVar3 = false;
                    local_470 = 0;
                    do {
                      random_axis((motion_derivative_regression_test *)&local_428.field_1);
                      fVar11 = std::
                               generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                                         (&this->rng);
                      fVar11 = (fVar11 + 0.0 + fVar11 + 0.0 + -1.0) * 6.2831855;
                      __x = fVar11 * 0.5;
                      iVar10 = 0;
                      do {
                        local_3e8 = ZEXT416((uint)(float)iVar10);
                        local_3d8 = powf(0.1,(float)iVar10);
                        _local_498 = ZEXT416((uint)local_428.m128[0]);
                        local_488._0_16_ = ZEXT416((uint)local_428.m128[1]);
                        local_4a8._0_4_ = local_428.m128[2];
                        local_3c8 = cosf(__x);
                        fVar12 = sinf(__x);
                        fVar18 = local_498._0_4_;
                        auVar13._4_12_ = local_498._4_12_;
                        auVar13._0_4_ =
                             fVar18 * fVar18 +
                             (float)local_488._0_4_ * (float)local_488._0_4_ +
                             (float)local_4a8._0_4_ * (float)local_4a8._0_4_;
                        auVar14._4_4_ = local_498._4_4_;
                        auVar14._0_4_ = auVar13._0_4_;
                        auVar14._8_4_ = local_498._8_4_;
                        auVar14._12_4_ = local_498._12_4_;
                        auVar15 = rsqrtss(auVar14,auVar13);
                        fVar17 = auVar15._0_4_;
                        register0x00001304 = auVar15._4_12_;
                        fVar17 = fVar17 * 1.5 - fVar17 * fVar17 * auVar13._0_4_ * 0.5 * fVar17;
                        local_498._0_4_ = fVar18 * fVar17 * fVar12;
                        local_488._0_4_ = (float)local_488._0_4_ * fVar17 * fVar12;
                        local_4a8._0_4_ = fVar17 * (float)local_4a8._0_4_ * fVar12;
                        local_368 = ZEXT416((uint)local_428.m128[0]);
                        local_378 = ZEXT416((uint)local_428.m128[1]);
                        uVar2 = local_428.m128[2];
                        unique0x10001319 = auVar13._4_12_;
                        fVar12 = std::
                                 generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                                           (&this->rng);
                        local_3e8._0_4_ =
                             ((float)(~-(uint)(0.5 < fVar12) & local_3e8._0_4_ |
                                     (local_3e8._0_4_ ^ 0x80000000) & -(uint)(0.5 < fVar12)) *
                              local_3d8 + fVar11) * 0.5;
                        local_3d8 = cosf((float)local_3e8._0_4_);
                        fVar12 = sinf((float)local_3e8._0_4_);
                        uStack_490._4_4_ = local_3c8;
                        uVar1 = local_4a8._0_4_;
                        fVar18 = (float)local_368._0_4_ * (float)local_368._0_4_ +
                                 (float)local_378._0_4_ * (float)local_378._0_4_ +
                                 (float)uVar2 * (float)uVar2;
                        auVar16._4_4_ = local_368._4_4_;
                        auVar16._0_4_ = fVar18;
                        auVar16._8_4_ = local_368._8_4_;
                        auVar16._12_4_ = local_368._12_4_;
                        auVar15._4_4_ = local_368._4_4_;
                        auVar15._0_4_ = fVar18;
                        auVar15._8_4_ = local_368._8_4_;
                        auVar15._12_4_ = local_368._12_4_;
                        auVar15 = rsqrtss(auVar16,auVar15);
                        fVar17 = auVar15._0_4_;
                        fVar17 = fVar17 * 1.5 - fVar17 * fVar17 * fVar18 * 0.5 * fVar17;
                        fStack_3bc = (float)local_498._0_4_;
                        local_468._0_8_ = 0x3f800000;
                        local_468._8_8_ =
                             (ulong)(uint)((float)local_368._0_4_ * fVar17 * fVar12) << 0x20;
                        local_458 = 0x3f80000000000000;
                        lStack_450 = (ulong)(uint)((float)local_378._0_4_ * fVar17 * fVar12) << 0x20
                        ;
                        local_448 = 0;
                        uStack_440 = CONCAT44(fVar17 * (float)uVar2 * fVar12,0x3f800000);
                        local_438 = 0;
                        lStack_430 = (ulong)(uint)local_3d8 << 0x20;
                        local_3c8 = 1.0;
                        uStack_3c4 = 0;
                        uStack_3c0 = 0;
                        local_4e8._0_8_ = 0x3f800000;
                        local_4e8._8_8_ = (ulong)(uint)local_498._0_4_ << 0x20;
                        _local_4a8 = ZEXT812(0x3f80000000000000);
                        uStack_4a0._4_4_ = local_488._0_4_;
                        local_4d8 = 0x3f80000000000000;
                        lStack_4d0 = (ulong)local_488._0_4_ << 0x20;
                        local_488._0_12_ = ZEXT412(0x3f800000) << 0x40;
                        local_488._12_4_ = uVar1;
                        local_4c8 = 0;
                        uStack_4c0 = CONCAT44(uVar1,0x3f800000);
                        _local_498 = ZEXT812(0);
                        local_4b8 = 0;
                        lStack_4b0 = (ulong)(uint)uStack_490._4_4_ << 0x20;
                        MotionDerivativeCoefficients::MotionDerivativeCoefficients
                                  (&local_2d8,(AffineSpace3ff *)&local_4e8.field_1,
                                   (AffineSpace3ff *)&local_468.field_1);
                        bVar4 = testMDC(this,&local_2d8);
                        if (!bVar4) {
                          return bVar3;
                        }
                        local_4e8._0_8_ = CONCAT44(uStack_3c4,local_3c8);
                        local_4e8._8_8_ = CONCAT44(fStack_3bc,uStack_3c0);
                        local_4d8 = local_4a8;
                        lStack_4d0 = uStack_4a0;
                        local_4c8 = local_488._0_8_;
                        uStack_4c0 = local_488._8_8_;
                        local_4b8 = local_498;
                        lStack_4b0 = uStack_490;
                        local_458 = local_4a8;
                        lStack_450 = uStack_4a0;
                        local_448 = local_488._0_8_;
                        uStack_440 = local_488._8_8_;
                        local_438 = local_498;
                        lStack_430 = uStack_490;
                        local_468._0_8_ = local_4e8._0_8_;
                        local_468._8_8_ = local_4e8._8_8_;
                        MotionDerivativeCoefficients::MotionDerivativeCoefficients
                                  (&local_2d8,(AffineSpace3ff *)&local_4e8.field_1,
                                   (AffineSpace3ff *)&local_468.field_1);
                        bVar4 = testMDC(this,&local_2d8);
                        if (!bVar4) {
                          return bVar3;
                        }
                        iVar10 = iVar10 + 1;
                      } while (iVar10 != 0x10);
                      bVar3 = 0x3e < (uint)local_470;
                      uVar5 = (uint)local_470 + 1;
                      local_470 = (ulong)uVar5;
                      if (uVar5 == 0x40) {
                        return bVar3;
                      }
                    } while( true );
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool run ()
    {
      bool passed = true;
#if 0
      std::random_device device;
      size_t seed = device();
#else
      // tests fails for this seed if MOTION_DERIVATIVE_ROOT_EPSILON is 1e-6f instead of 1e-4f
      size_t seed = 2973843361;
#endif
      rng.seed(seed);

      ////////////////////////////////////////////////////////////////////////////////
      // test root solver
      ////////////////////////////////////////////////////////////////////////////////
      unsigned int maxNumRoots = 32;
      float roots[32];
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
            return (t - 1.0) * (t + 1.0);
        }};
        Interval1f I(-2.f, 2.f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 2) return false;
        if (abs(roots[0]+1.f) > 1e6f) return false;
        if (abs(roots[1]-1.f) > 1e6f) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return (t - 1.0f) * (t + 1.0f) * (t + 0.99999f);
        }};
        Interval1f I(-2.f, 2.f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 2) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return (t - 1.0f) * (t + 1.0f) * (t + 0.9999f);
        }};
        Interval1f I(-2.f, 2.f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 3) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return (-7.831048f) + (70.619041f) + (-116.007454f) * t
            + ((-198.235809f) + ( 411.193054f) * t + (-160.020020f) * t * t) * cos(5.438017f * t)
            + ((-320.571472f) + ( 786.181946f) * t + (-559.993164f) * t * t) * sin(5.438017f * t);
        }};
        Interval1f I(0.5, 1.4f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 3) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return sin(t) * cos(t-1.0f) * 50 * (t-2.0f) * (t-4.0f);
        }};
        Interval1f I(0.0, 7.0f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 7) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return sin(t) * cos(t-1) * 0.0000001f * (t-2.0f) * (t-4.0f);
        }};
        Interval1f I(0.0, 7.0f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 7) return false;
      }
      {
        // all roots are of the form n*PI/10 for n = 0, 1, 2, ...
        // the function values vary from 0 to 3000
        // in a plot everything from 0 to 0.5 looks like constant zero
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return sin(10.0f * t) * 100.0f * t*t*t*t*t;
        }};
        Interval1f I(0.0, 2.0f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 7) return false;
        for (int i = 0; i < 7; ++i) {
          if (abs(roots[i]-(i*M_PI)/10.f) > 1e-6f)
            return false;
        }
      }

      ////////////////////////////////////////////////////////////////////////////////
      // test motion derivative coefficients
      ////////////////////////////////////////////////////////////////////////////////
      const size_t numTests = 64;

      // test completely random transformations
      for (int j = 0; j < numTests; ++j)
      {
        AffineSpace3fa M0 = random_quaternion_decomposition();
        AffineSpace3fa M1 = random_quaternion_decomposition();
        if (!testMDC(MotionDerivativeCoefficients(M0, M1))) return false;
        if (!testMDC(MotionDerivativeCoefficients(M0, M0))) return false;
      }

      // test transformations with slightly different rotation angles
      for (int j = 0; j < numTests; ++j)
      {
        Vec3fa axis = random_axis();
        float angle = 2.f * M_PI * (2.f * rand01() - 1.f);
        AffineSpace3fa S(one);
        Vec3fa T(0.f);

        for (int k = 0; k < 16; ++k)
        {
          float eps = pow(0.1f, k);
          Quaternion3f q0 = Quaternion3f::rotate(axis, angle);
          Quaternion3f q1 = Quaternion3f::rotate(axis, angle + (rand01() > 0.5f ? -1.f : 1.f) * k * eps);
          AffineSpace3fa M0 = quaternionDecomposition(T, q0, S);
          AffineSpace3fa M1 = quaternionDecomposition(T, q1, S);
          if (!testMDC(MotionDerivativeCoefficients(M0, M1))) return false;
          if (!testMDC(MotionDerivativeCoefficients(M0, M0))) return false;
        }
      }


      return passed;
    }